

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CCallMethodExp *exp)

{
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
  *this_00;
  mapped_type *pmVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  element_type *peVar7;
  element_type *peVar8;
  size_type expected;
  pointer pCVar9;
  size_type got;
  element_type *peVar10;
  reference __k;
  mapped_type *pmVar11;
  unique_ptr *this_01;
  reference pvVar12;
  pointer pIVar13;
  element_type *peVar14;
  element_type *peVar15;
  TypeInfo local_348;
  CError local_320;
  TypeInfo local_2f0;
  CError local_2c8;
  undefined1 local_298 [8];
  string errorMessage_1;
  undefined1 local_278 [8];
  element_type expectedArgumentType;
  mapped_type argumentInfo;
  undefined1 local_238 [4];
  int index;
  shared_ptr<VariablesInfo> argumentsInfo;
  CError local_200;
  undefined1 local_1d0 [8];
  string errorMessage;
  size_type gotNumberOfArguments;
  size_type expectedNumberOfArguments;
  mapped_type methodInfo;
  undefined1 local_168 [80];
  shared_ptr<ClassInfo> local_118;
  undefined1 local_108 [8];
  mapped_type classInfo;
  string methodName;
  TypeInfo local_d8;
  CError local_b0;
  int local_7c;
  TypeInfo local_78;
  byte local_39;
  string local_38 [7];
  bool isThis;
  string identifierName;
  CCallMethodExp *exp_local;
  CTypeCheckerVisitor *this_local;
  
  std::operator<<((ostream *)&std::cout,"typechecker: CCallMethodExp\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->args);
  if ((!bVar1) ||
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->methodName), !bVar1)) {
    CError::CError(&local_320,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_320);
    CError::~CError(&local_320);
    TypeInfo::TypeInfo(&local_348,ERROR_TYPE);
    TypeInfo::operator=(&this->lastCalculatedType,&local_348);
    TypeInfo::~TypeInfo(&local_348);
    return;
  }
  peVar2 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->currentClass);
  std::__cxx11::string::string(local_38,(string *)peVar2);
  local_39 = 1;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->objectExpression);
  if (bVar1) {
    pIVar13 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                        (&exp->objectExpression);
    (**(pIVar13->super_PositionedNode).super_INode._vptr_INode)(pIVar13,this);
    TypeInfo::TypeInfo(&local_78,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_78);
    TypeInfo::~TypeInfo(&local_78);
    if (bVar1) {
      local_7c = 1;
      goto LAB_00140304;
    }
    std::__cxx11::string::operator=(local_38,(string *)&(this->lastCalculatedType).className);
    local_39 = 0;
    if (((this->lastCalculatedType).isPrimitive & 1U) != 0) {
      CError::CError(&local_b0,(string *)CError::IS_NOT_CALLABLE_abi_cxx11_,
                     &(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_b0);
      CError::~CError(&local_b0);
      TypeInfo::TypeInfo(&local_d8,ERROR_TYPE);
      TypeInfo::operator=(&this->lastCalculatedType,&local_d8);
      TypeInfo::~TypeInfo(&local_d8);
      local_7c = 1;
      goto LAB_00140304;
    }
  }
  pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&exp->methodName);
  std::__cxx11::string::string
            ((string *)
             &classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)&pCVar3->name);
  this_00 = &std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->table)->classes;
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
           ::operator[](this_00,(key_type *)local_38);
  std::shared_ptr<ClassInfo>::shared_ptr((shared_ptr<ClassInfo> *)local_108,pmVar4);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           (string *)
                           &classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  poVar5 = std::operator<<(poVar5," ");
  peVar2 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_108);
  poVar5 = std::operator<<(poVar5,(string *)peVar2);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(local_39 & 1));
  std::operator<<(poVar5,"\n");
  std::shared_ptr<ClassInfo>::shared_ptr(&local_118,(shared_ptr<ClassInfo> *)local_108);
  bVar1 = checkMethodVisibility
                    (this,(string *)
                          &classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,&local_118,(bool)(local_39 & 1));
  std::shared_ptr<ClassInfo>::~shared_ptr(&local_118);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    peVar2 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_108);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
             ::operator[](&peVar2->methods,
                          (key_type *)
                          &classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    std::shared_ptr<MethodInfo>::shared_ptr
              ((shared_ptr<MethodInfo> *)&expectedNumberOfArguments,pmVar6);
    peVar7 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&expectedNumberOfArguments);
    peVar8 = std::__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar7->arguments);
    expected = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>
               ::size(&peVar8->variables);
    pCVar9 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator->(&exp->args);
    got = std::
          vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
          ::size(&pCVar9->exps);
    if (expected == got) {
      peVar7 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&expectedNumberOfArguments);
      std::shared_ptr<VariablesInfo>::shared_ptr
                ((shared_ptr<VariablesInfo> *)local_238,&peVar7->arguments);
      for (argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._4_4_ = 0;
          (ulong)(long)argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_ < got;
          argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ + 1) {
        peVar8 = std::__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_238);
        peVar10 = std::__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<VariablesInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_238);
        __k = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&peVar10->variableNames,
                           (long)argumentInfo.
                                 super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._4_4_);
        pmVar11 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>_>
                  ::operator[](&peVar8->variables,__k);
        std::shared_ptr<VariableInfo>::shared_ptr
                  ((shared_ptr<VariableInfo> *)&expectedArgumentType.field_0x20,pmVar11);
        pCVar9 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator->(&exp->args);
        this_01 = (unique_ptr *)
                  std::
                  vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                  ::operator[](&pCVar9->exps,
                               (long)argumentInfo.
                                     super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
        bVar1 = std::unique_ptr::operator_cast_to_bool(this_01);
        if (bVar1) {
          pCVar9 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator->(&exp->args)
          ;
          pvVar12 = std::
                    vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                    ::operator[](&pCVar9->exps,
                                 (long)argumentInfo.
                                       super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi._4_4_);
          pIVar13 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                              (pvVar12);
          (**(pIVar13->super_PositionedNode).super_INode._vptr_INode)(pIVar13,this);
          peVar14 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&expectedArgumentType.field_0x20);
          peVar15 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator*((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar14->type);
          TypeInfo::TypeInfo((TypeInfo *)local_278,peVar15);
          bVar1 = ::operator!=(&this->lastCalculatedType,(TypeInfo *)local_278);
          if (bVar1) {
            CError::GetTypeErrorMessage_abi_cxx11_
                      ((CError *)local_298,(TypeInfo *)local_278,&this->lastCalculatedType);
            pCVar9 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator->
                               (&exp->args);
            pvVar12 = std::
                      vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                      ::operator[](&pCVar9->exps,
                                   (long)argumentInfo.
                                         super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi._4_4_);
            pIVar13 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                                (pvVar12);
            CError::CError(&local_2c8,(string *)local_298,&(pIVar13->super_PositionedNode).position)
            ;
            std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_2c8);
            CError::~CError(&local_2c8);
            TypeInfo::TypeInfo(&local_2f0,ERROR_TYPE);
            TypeInfo::operator=(&this->lastCalculatedType,&local_2f0);
            TypeInfo::~TypeInfo(&local_2f0);
            local_7c = 1;
            std::__cxx11::string::~string((string *)local_298);
          }
          else {
            local_7c = 0;
          }
          TypeInfo::~TypeInfo((TypeInfo *)local_278);
          if (local_7c == 0) goto LAB_0014025d;
        }
        else {
LAB_0014025d:
          local_7c = 0;
        }
        std::shared_ptr<VariableInfo>::~shared_ptr
                  ((shared_ptr<VariableInfo> *)&expectedArgumentType.field_0x20);
        if (local_7c != 0) goto LAB_001402d4;
      }
      peVar7 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&expectedNumberOfArguments);
      peVar15 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&peVar7->returnType);
      TypeInfo::operator=(&this->lastCalculatedType,peVar15);
      local_7c = 0;
LAB_001402d4:
      std::shared_ptr<VariablesInfo>::~shared_ptr((shared_ptr<VariablesInfo> *)local_238);
    }
    else {
      CError::GetNumberOfArgsMessage_abi_cxx11_((CError *)local_1d0,expected,got);
      CError::CError(&local_200,(string *)local_1d0,
                     &(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_200);
      CError::~CError(&local_200);
      TypeInfo::TypeInfo((TypeInfo *)
                         &argumentsInfo.
                          super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         ERROR_TYPE);
      TypeInfo::operator=(&this->lastCalculatedType,
                          (TypeInfo *)
                          &argumentsInfo.
                           super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         );
      TypeInfo::~TypeInfo((TypeInfo *)
                          &argumentsInfo.
                           super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         );
      local_7c = 1;
      std::__cxx11::string::~string((string *)local_1d0);
    }
    std::shared_ptr<MethodInfo>::~shared_ptr((shared_ptr<MethodInfo> *)&expectedNumberOfArguments);
  }
  else {
    CError::GetHasNoMemberErrorMessage
              ((CError *)local_168,(string *)local_38,
               (string *)
               &classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&exp->methodName);
    CError::CError((CError *)(local_168 + 0x20),(string *)local_168,
                   &(pCVar3->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back
              (&this->errors,(value_type *)(local_168 + 0x20));
    CError::~CError((CError *)(local_168 + 0x20));
    std::__cxx11::string::~string((string *)local_168);
    TypeInfo::TypeInfo((TypeInfo *)
                       &methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,ERROR_TYPE);
    TypeInfo::operator=(&this->lastCalculatedType,
                        (TypeInfo *)
                        &methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    TypeInfo::~TypeInfo((TypeInfo *)
                        &methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    local_7c = 1;
  }
  std::shared_ptr<ClassInfo>::~shared_ptr((shared_ptr<ClassInfo> *)local_108);
  std::__cxx11::string::~string
            ((string *)
             &classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00140304:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CCallMethodExp &exp )
{
    std::cout << "typechecker: CCallMethodExp\n";

    if( exp.args && exp.methodName ) {
        std::string identifierName = currentClass->name;
        bool isThis = true;
        if ( exp.objectExpression ) {
            exp.objectExpression->Accept( *this );
            if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
                return;
            }
            identifierName = lastCalculatedType.className;
            isThis = false;
            if( lastCalculatedType.isPrimitive ) {
                errors.push_back( CError( CError::IS_NOT_CALLABLE, exp.position ) );
                lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
                return;
            }
        }

		auto methodName = exp.methodName->name;
        auto classInfo = table->classes[identifierName];
        std::cout << methodName << " " << classInfo->name << " " << isThis << "\n";
		if( !checkMethodVisibility( methodName, classInfo, isThis ) ) {
			errors.push_back( CError( CError::GetHasNoMemberErrorMessage( identifierName, methodName ), exp.methodName->position ) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
			return;
		}
		auto methodInfo = classInfo->methods[methodName];
		auto expectedNumberOfArguments = methodInfo->arguments->variables.size();
        auto gotNumberOfArguments = exp.args->exps.size();
        if( expectedNumberOfArguments != gotNumberOfArguments ) {
			auto errorMessage = CError::GetNumberOfArgsMessage( expectedNumberOfArguments, gotNumberOfArguments );
			errors.push_back( CError( errorMessage, exp.position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
			return;
		}
        auto argumentsInfo = methodInfo->arguments;
        for( int index = 0; index < gotNumberOfArguments; ++index ) {
            auto argumentInfo = argumentsInfo->variables[argumentsInfo->variableNames[index]];
            if( exp.args->exps[index] ) {
                exp.args->exps[index]->Accept( *this );
                auto expectedArgumentType = *( argumentInfo->type );
                if( lastCalculatedType != expectedArgumentType ) {
                    auto errorMessage = CError::GetTypeErrorMessage(expectedArgumentType, lastCalculatedType);
                    errors.push_back( CError( errorMessage, exp.args->exps[index]->position ) );
                    lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
                    return;
                }
            }
		}
		lastCalculatedType = *( methodInfo->returnType );
	} else {
		errors.push_back( CError( CError::AST_ERROR, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
    }
}